

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enter.hpp
# Opt level: O0

void __thiscall soplex::SPxSolverBase<double>::updateTest(SPxSolverBase<double> *this)

{
  bool bVar1;
  int n;
  IdxSet *this_00;
  char *pcVar2;
  double *pdVar3;
  int *piVar4;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar5;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  long in_RDI;
  double dVar6;
  Status unaff_retaddr;
  int unaff_retaddr_00;
  SPxSolverBase<double> *in_stack_00000008;
  Status stat;
  int j;
  int i;
  double pricingTol;
  Desc *ds;
  IdxSet *idx;
  undefined4 in_stack_ffffffffffffffb8;
  Status in_stack_ffffffffffffffbc;
  SPxSolverBase<double> *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  uint local_24;
  
  UpdateVector<double>::delta(*(UpdateVector<double> **)(in_RDI + 0x6c0));
  SSVectorBase<double>::setup
            ((SSVectorBase<double> *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  this_00 = UpdateVector<double>::idx((UpdateVector<double> *)0x27af38);
  SPxBasisBase<double>::desc((SPxBasisBase<double> *)(in_RDI + 0x1c8));
  dVar6 = leavetol((SPxSolverBase<double> *)
                   CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  IdxSet::clear((IdxSet *)(in_RDI + 0x848));
  local_24 = IdxSet::size(this_00);
  uVar5 = extraout_RDX;
  while (local_24 = local_24 - 1, -1 < (int)local_24) {
    pcVar2 = IdxSet::index(this_00,(char *)(ulong)local_24,(int)uVar5);
    n = (int)pcVar2;
    SPxBasisBase<double>::Desc::status((Desc *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    bVar1 = isBasic(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    if (bVar1) {
      piVar4 = DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0x880),n);
      *piVar4 = 0;
      pdVar3 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc)
      ;
      *pdVar3 = 0.0;
      uVar5 = extraout_RDX_06;
    }
    else {
      if (((*(byte *)(in_RDI + 0x368) & 1) != 0) &&
         (pdVar3 = VectorBase<double>::operator[]
                             ((VectorBase<double> *)in_stack_ffffffffffffffc0,
                              in_stack_ffffffffffffffbc), *pdVar3 < -dVar6)) {
        pdVar3 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_ffffffffffffffc0,
                            in_stack_ffffffffffffffbc);
        *(double *)(in_RDI + 0x360) = *pdVar3 + *(double *)(in_RDI + 0x360);
      }
      in_stack_ffffffffffffffc0 =
           (SPxSolverBase<double> *)test(in_stack_00000008,unaff_retaddr_00,unaff_retaddr);
      pdVar3 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc)
      ;
      *pdVar3 = (double)in_stack_ffffffffffffffc0;
      if ((*(byte *)(in_RDI + 0x89a) & 1) == 0) {
        pdVar3 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_ffffffffffffffc0,
                            in_stack_ffffffffffffffbc);
        uVar5 = extraout_RDX_04;
        if (*pdVar3 < -dVar6) {
          pdVar3 = VectorBase<double>::operator[]
                             ((VectorBase<double> *)in_stack_ffffffffffffffc0,
                              in_stack_ffffffffffffffbc);
          *(double *)(in_RDI + 0x360) = *(double *)(in_RDI + 0x360) - *pdVar3;
          uVar5 = extraout_RDX_05;
        }
      }
      else {
        pdVar3 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_ffffffffffffffc0,
                            in_stack_ffffffffffffffbc);
        if (-dVar6 <= *pdVar3) {
          piVar4 = DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0x880),n);
          *piVar4 = 0;
          uVar5 = extraout_RDX_03;
        }
        else {
          pdVar3 = VectorBase<double>::operator[]
                             ((VectorBase<double> *)in_stack_ffffffffffffffc0,
                              in_stack_ffffffffffffffbc);
          *(double *)(in_RDI + 0x360) = *(double *)(in_RDI + 0x360) - *pdVar3;
          piVar4 = DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0x880),n);
          uVar5 = extraout_RDX_00;
          if (*piVar4 == 0) {
            DIdxSet::addIdx((DIdxSet *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
            piVar4 = DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0x880),n);
            *piVar4 = 1;
            uVar5 = extraout_RDX_01;
          }
          if ((*(byte *)(in_RDI + 0x89c) & 1) != 0) {
            DIdxSet::addIdx((DIdxSet *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
            uVar5 = extraout_RDX_02;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void SPxSolverBase<R>::updateTest()
{
   thePvec->delta().setup();

   const IdxSet& idx = thePvec->idx();
   const typename SPxBasisBase<R>::Desc& ds = this->desc();
   R pricingTol = leavetol();

   int i;
   updateViolsCo.clear();

   for(i = idx.size() - 1; i >= 0; --i)
   {
      int j = idx.index(i);
      typename SPxBasisBase<R>::Desc::Status stat = ds.status(j);

      if(!isBasic(stat))
      {
         if(m_pricingViolCoUpToDate && theTest[j] < -pricingTol)
            m_pricingViolCo += theTest[j];

         theTest[j] = test(j, stat);

         if(sparsePricingEnterCo)
         {
            if(theTest[j] < -pricingTol)
            {
               assert(remainingRoundsEnterCo == 0);
               m_pricingViolCo -= theTest[j];

               if(isInfeasibleCo[j] == SPxPricer<R>::NOT_VIOLATED)
               {
                  infeasibilitiesCo.addIdx(j);
                  isInfeasibleCo[j] = SPxPricer<R>::VIOLATED;
               }

               if(hyperPricingEnter)
                  updateViolsCo.addIdx(j);
            }
            else
            {
               isInfeasibleCo[j] = SPxPricer<R>::NOT_VIOLATED;
            }
         }
         else if(theTest[j] < -pricingTol)
            m_pricingViolCo -= theTest[j];
      }
      else
      {
         isInfeasibleCo[j] = SPxPricer<R>::NOT_VIOLATED;
         theTest[j] = 0;
      }
   }
}